

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

bool slang::syntax::RsCaseItemSyntax::isKind(SyntaxKind kind)

{
  SyntaxKind kind_local;
  bool local_1;
  
  if ((kind == DefaultRsCaseItem) || (kind == StandardRsCaseItem)) {
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool RsCaseItemSyntax::isKind(SyntaxKind kind) {
    switch (kind) {
        case SyntaxKind::DefaultRsCaseItem:
        case SyntaxKind::StandardRsCaseItem:
            return true;
        default:
            return false;
    }
}